

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::__cxx11::string_const&>::
captureExpression<(Catch::Internal::Operator)0,char[13]>
          (ExpressionLhs<std::__cxx11::string_const&> *this,char (*rhs) [13])

{
  bool result;
  ResultBuilder *pRVar1;
  char *pcVar2;
  allocator local_89;
  string local_88 [32];
  Catch local_68 [48];
  Catch local_38 [32];
  char (*local_18) [13];
  char (*rhs_local) [13];
  ExpressionLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  pRVar1 = *(ResultBuilder **)this;
  local_18 = rhs;
  rhs_local = (char (*) [13])this;
  result = Internal::compare<(Catch::Internal::Operator)0,std::__cxx11::string,char[13]>
                     (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  Catch::toString(local_38,*(string **)(this + 8));
  pRVar1 = ResultBuilder::setLhs(pRVar1,(string *)local_38);
  Catch::toString_abi_cxx11_(local_68,*local_18);
  pRVar1 = ResultBuilder::setRhs(pRVar1,(string *)local_68);
  pcVar2 = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar2,&local_89);
  pRVar1 = ResultBuilder::setOp(pRVar1,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }